

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_getopt_long.c
# Opt level: O0

void permute_args(int panonopt_start,int panonopt_end,int opt_end,char **nargv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *swap;
  int pos;
  int nopts;
  int nnonopts;
  int ncycle;
  int j;
  int i;
  int cyclelen;
  int cstart;
  char **nargv_local;
  int opt_end_local;
  int panonopt_end_local;
  int panonopt_start_local;
  
  iVar3 = gcd(panonopt_end - panonopt_start,opt_end - panonopt_end);
  for (ncycle = 0; ncycle < iVar3; ncycle = ncycle + 1) {
    iVar4 = panonopt_end + ncycle;
    swap._0_4_ = iVar4;
    for (nnonopts = 0; nnonopts < (opt_end - panonopt_start) / iVar3; nnonopts = nnonopts + 1) {
      iVar2 = opt_end - panonopt_end;
      if (panonopt_end <= (int)swap) {
        iVar2 = -(panonopt_end - panonopt_start);
      }
      swap._0_4_ = (int)swap + iVar2;
      pcVar1 = nargv[(int)swap];
      nargv[(int)swap] = nargv[iVar4];
      nargv[iVar4] = pcVar1;
    }
  }
  return;
}

Assistant:

static void
permute_args(int panonopt_start, int panonopt_end, int opt_end,
	char * const *nargv)
{
	int cstart, cyclelen, i, j, ncycle, nnonopts, nopts, pos;
	char *swap;

	/*
	 * compute lengths of blocks and number and size of cycles
	 */
	nnonopts = panonopt_end - panonopt_start;
	nopts = opt_end - panonopt_end;
	ncycle = gcd(nnonopts, nopts);
	cyclelen = (opt_end - panonopt_start) / ncycle;

	for (i = 0; i < ncycle; i++) {
		cstart = panonopt_end+i;
		pos = cstart;
		for (j = 0; j < cyclelen; j++) {
			if (pos >= panonopt_end)
				pos -= nnonopts;
			else
				pos += nopts;
			swap = nargv[pos];
			/* LINTED const cast */
			((char **) nargv)[pos] = nargv[cstart];
			/* LINTED const cast */
			((char **)nargv)[cstart] = swap;
		}
	}
}